

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# native.c
# Opt level: O3

void register_native(Environment *env)

{
  Object value;
  Object value_00;
  undefined1 auVar1 [56];
  undefined1 auVar2 [56];
  undefined8 *puVar3;
  Routine r_2;
  Routine r;
  undefined4 uStack_114;
  undefined4 uStack_104;
  undefined6 uStack_f6;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined4 uStack_dc;
  undefined4 uStack_cc;
  undefined6 uStack_be;
  undefined8 uStack_b8;
  undefined8 local_b0;
  Object local_a8;
  Object local_68;
  
  puVar3 = (undefined8 *)malloc(8);
  *puVar3 = "x";
  auVar1._16_4_ = uStack_cc;
  auVar1._12_4_ = 1;
  auVar1._30_6_ = uStack_be;
  auVar1._28_2_ = 1;
  auVar1._4_8_ = "LoadLibrary";
  auVar1._0_4_ = uStack_dc;
  auVar1._20_8_ = puVar3;
  auVar1._36_8_ = uStack_b8;
  auVar1._44_8_ = local_b0;
  auVar1._52_4_ = 0;
  env_routine_put((Routine)(auVar1 << 0x20),0,env);
  puVar3 = (undefined8 *)malloc(8);
  *puVar3 = "x";
  auVar2._16_4_ = uStack_104;
  auVar2._12_4_ = 1;
  auVar2._30_6_ = uStack_f6;
  auVar2._28_2_ = 1;
  auVar2._4_8_ = "UnloadLibrary";
  auVar2._0_4_ = uStack_114;
  auVar2._20_8_ = puVar3;
  auVar2._36_8_ = uStack_f0;
  auVar2._44_8_ = local_e8;
  auVar2._52_4_ = 0;
  env_routine_put((Routine)(auVar2 << 0x20),0,env);
  fromDouble(&local_a8,3.141592653589793);
  value.field_1.instance = local_a8.field_1.instance;
  value.type = local_a8.type;
  value._4_4_ = local_a8._4_4_;
  value.field_1._8_8_ = local_a8.field_1._8_8_;
  value.field_1._16_8_ = local_a8.field_1._16_8_;
  value.field_1.routine.arguments = local_a8.field_1.routine.arguments;
  value.field_1._32_8_ = local_a8.field_1._32_8_;
  value.field_1.container.constructor.statements = local_a8.field_1.container.constructor.statements
  ;
  value.field_1.routine.code.statements = local_a8.field_1.routine.code.statements;
  env_put("Math_Pi",0,value,env);
  fromDouble(&local_68,2.718281828459045);
  value_00.field_1.instance = local_68.field_1.instance;
  value_00.type = local_68.type;
  value_00._4_4_ = local_68._4_4_;
  value_00.field_1._8_8_ = local_68.field_1._8_8_;
  value_00.field_1._16_8_ = local_68.field_1._16_8_;
  value_00.field_1.routine.arguments = local_68.field_1.routine.arguments;
  value_00.field_1._32_8_ = local_68.field_1._32_8_;
  value_00.field_1.container.constructor.statements =
       local_68.field_1.container.constructor.statements;
  value_00.field_1.routine.code.statements = local_68.field_1.routine.code.statements;
  env_put("Math_E",0,value_00,env);
  load_library(&local_a8,0,(Environment *)0x0,"./libnmath.so");
  return;
}

Assistant:

void register_native(Environment *env){
    env_routine_put(getSingleArgRoutine("LoadLibrary"), 0, env);
    env_routine_put(getSingleArgRoutine("UnloadLibrary"), 0, env);
    define_cons(env);
    load_library(0, NULL, "./libnmath.so");
}